

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

amqp_rpc_reply_t *
amqp_login_inner(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,char *vhost,
                int channel_max,int frame_max,int heartbeat,amqp_table_t *client_properties,
                timeval *timeout,amqp_sasl_method_enum sasl_method,__va_list_tag *vl)

{
  amqp_table_t *result;
  ushort uVar1;
  uint uVar2;
  void *pvVar3;
  amqp_bytes_t aVar4;
  amqp_bytes_t aVar5;
  int iVar6;
  amqp_pool_t *pool;
  undefined8 *puVar7;
  amqp_pool_t *__n;
  size_t sVar8;
  uint uVar9;
  undefined4 in_register_0000000c;
  amqp_time_t decoded;
  amqp_method_number_t extraout_EDX;
  uint uVar10;
  char *pcVar11;
  undefined1 *__dest;
  amqp_pool_t *local_248;
  amqp_time_t deadline;
  amqp_method_t method;
  amqp_table_entry_t local_210;
  char *local_1e8;
  char *local_1e0;
  amqp_table_t client_capabilities_table;
  undefined1 local_1c8 [24];
  anon_union_16_15_ecedea02_for_value local_1b0;
  size_t local_1a0;
  undefined1 *puStack_198;
  undefined1 local_190 [24];
  amqp_table_t default_table;
  amqp_method_number_t replies [2];
  amqp_connection_tune_ok_t s;
  
  decoded.time_point_ns = CONCAT44(in_register_0000000c,channel_max);
  if (((0xffff < (uint)channel_max) || (frame_max < 0)) || (0xffff < (uint)heartbeat)) {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = -10;
    return __return_storage_ptr__;
  }
  local_1e0 = vhost;
  iVar6 = amqp_time_from_now(&deadline,timeout);
  uVar10 = heartbeat;
  if ((((iVar6 == 0) && (iVar6 = send_header_inner(state,deadline), iVar6 == 0)) &&
      ((decoded = deadline, iVar6 = simple_wait_method_inner(state,0,0xa000a,deadline,&method),
       pvVar3 = method.decoded, iVar6 == 0 &&
       ((iVar6 = -6, *method.decoded == '\0' && (*(char *)((long)method.decoded + 1) == '\t'))))))
     && (iVar6 = amqp_table_clone((amqp_table_t *)((long)method.decoded + 8),
                                  &state->server_properties,&state->properties_pool), iVar6 == 0)) {
    iVar6 = sasl_mechanism_in_list(*(amqp_bytes_t *)((long)pvVar3 + 0x18),sasl_method);
    if (iVar6 == 0) {
      iVar6 = -0x13;
    }
    else {
      pool = amqp_get_or_create_channel_pool(state,0);
      iVar6 = -1;
      if (pool != (amqp_pool_t *)0x0) {
        if (sasl_method == AMQP_SASL_METHOD_EXTERNAL) {
          uVar9 = vl->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            puVar7 = (undefined8 *)((ulong)uVar9 + (long)vl->reg_save_area);
            __n = (amqp_pool_t *)(ulong)(uVar9 + 8);
            vl->gp_offset = uVar9 + 8;
          }
          else {
            puVar7 = (undefined8 *)vl->overflow_arg_area;
            __n = (amqp_pool_t *)(puVar7 + 1);
            vl->overflow_arg_area = __n;
          }
          pcVar11 = (char *)*puVar7;
          local_248 = (amqp_pool_t *)strlen(pcVar11);
          amqp_pool_alloc_bytes(pool,(size_t)local_248,&local_210.key);
          decoded.time_point_ns = (uint64_t)__n;
          __dest = (undefined1 *)local_210.key.bytes;
          if ((undefined1 *)local_210.key.bytes != (undefined1 *)0x0) goto LAB_001093dc;
        }
        else {
          if (sasl_method != AMQP_SASL_METHOD_PLAIN) {
            amqp_abort("Invalid SASL method: %d",(ulong)(uint)sasl_method);
          }
          local_248 = (amqp_pool_t *)(ulong)vl->gp_offset;
          if (local_248 < 0x29) {
            puVar7 = (undefined8 *)((long)local_248 + (long)vl->reg_save_area);
            uVar9 = vl->gp_offset + 8;
            local_248 = (amqp_pool_t *)(ulong)uVar9;
            vl->gp_offset = uVar9;
          }
          else {
            puVar7 = (undefined8 *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar7 + 1;
          }
          pcVar11 = (char *)*puVar7;
          __n = (amqp_pool_t *)strlen(pcVar11);
          if ((uint)local_248 < 0x29) {
            puVar7 = (undefined8 *)((long)local_248 + (long)vl->reg_save_area);
            vl->gp_offset = (uint)local_248 + 8;
          }
          else {
            puVar7 = (undefined8 *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar7 + 1;
          }
          local_1e8 = (char *)*puVar7;
          local_248 = (amqp_pool_t *)strlen(local_1e8);
          sVar8 = strlen(pcVar11);
          decoded.time_point_ns = (uint64_t)local_248;
          amqp_pool_alloc_bytes(pool,(long)&local_248->pagesize + sVar8 + 2,&local_210.key);
          pvVar3 = local_210.key.bytes;
          if ((undefined1 *)local_210.key.bytes != (undefined1 *)0x0) {
            *(undefined1 *)local_210.key.bytes = 0;
            memcpy((undefined1 *)((long)local_210.key.bytes + 1),pcVar11,(size_t)__n);
            ((undefined1 *)((long)pvVar3 + 1))[(long)__n] = 0;
            pcVar11 = local_1e8;
            __dest = (undefined1 *)((long)pvVar3 + (long)__n) + 2;
LAB_001093dc:
            memcpy(__dest,pcVar11,(size_t)local_248);
            decoded.time_point_ns = (uint64_t)__n;
          }
        }
        if ((undefined1 *)local_210.key.bytes != (undefined1 *)0x0) {
          amqp_table_construct_bool_entry
                    ((amqp_table_entry_t *)local_1c8,"authentication_failure_close",1);
          amqp_table_construct_bool_entry(&local_210,"exchange_exchange_bindings",1);
          client_capabilities_table.entries = (amqp_table_entry_t_ *)local_1c8;
          local_190._16_8_ = local_210.value.value.bytes.bytes;
          local_190._0_8_ = local_210.value._0_8_;
          local_190._8_8_ = local_210.value.value.i64;
          local_1a0 = local_210.key.len;
          puStack_198 = (undefined1 *)local_210.key.bytes;
          client_capabilities_table.num_entries = 2;
          amqp_table_construct_utf8_entry((amqp_table_entry_t *)&s,"product","rabbitmq-c");
          amqp_table_construct_utf8_entry(&local_210,"version","0.16.0-pre");
          amqp_table_construct_utf8_entry(&local_210,"platform","Linux");
          amqp_table_construct_utf8_entry
                    (&local_210,"copyright",
                     "Copyright (c) 2007-2014 VMWare Inc, Tony Garnock-Jones, and Alan Antonuk.");
          amqp_table_construct_utf8_entry
                    (&local_210,"information","See https://github.com/alanxz/rabbitmq-c");
          amqp_table_construct_table_entry(&local_210,"capabilities",&client_capabilities_table);
          default_table.num_entries = 6;
          result = &state->client_properties;
          default_table.entries = (amqp_table_entry_t *)&s;
          iVar6 = amqp_merge_capabilities(&default_table,client_properties,result,pool);
          decoded.time_point_ns = (uint64_t)pool;
          if (iVar6 == 0) {
            replies[0] = result->num_entries;
            replies[1] = *(amqp_method_number_t *)&result->field_0x4;
            decoded.time_point_ns = (uint64_t)replies;
            sasl_method_name(sasl_method);
            iVar6 = amqp_send_method_inner(state,0,0xa000b,(void *)decoded.time_point_ns,0,deadline)
            ;
            if (-1 < iVar6) {
              amqp_release_buffers(state);
              decoded = deadline;
              iVar6 = amqp_simple_wait_method_list
                                (state,0,(amqp_method_number_t *)&DAT_0010c4e0,deadline,&method);
              if (iVar6 == 0) {
                if (method.id == 0xa0032) {
                  local_1b0.boolean = 0;
                  local_1c8._8_4_ = 0xa0032;
                  local_1c8._0_4_ = AMQP_RESPONSE_SERVER_EXCEPTION;
                  goto LAB_001091d7;
                }
                uVar1 = *method.decoded;
                uVar9 = -(uint)(uVar1 == 0) | channel_max;
                if (channel_max != 0) {
                  uVar9 = channel_max;
                }
                uVar10 = (uint)uVar1;
                if (channel_max - 1U < (uint)uVar1) {
                  uVar10 = uVar9;
                }
                uVar2 = *(uint *)((long)method.decoded + 4);
                if (uVar1 == 0) {
                  uVar10 = uVar9;
                }
                channel_max = frame_max;
                if (uVar2 < (uint)frame_max) {
                  channel_max = uVar2;
                }
                uVar1 = *(ushort *)((long)method.decoded + 8);
                if (uVar2 == 0) {
                  channel_max = frame_max;
                }
                frame_max = heartbeat;
                if ((uint)uVar1 < (uint)heartbeat) {
                  frame_max = (uint)uVar1;
                }
                if (uVar1 == 0) {
                  frame_max = heartbeat;
                }
                decoded.time_point_ns = (uint64_t)(frame_max & 0xffffU);
                iVar6 = amqp_tune_connection(state,uVar10 & 0xffff,channel_max,frame_max & 0xffffU);
                aVar4 = _s;
                if (-1 < iVar6) {
                  decoded.time_point_ns = (uint64_t)&s;
                  s.frame_max = channel_max;
                  s.channel_max = (short)uVar10;
                  aVar5 = _s;
                  stack0xfffffffffffffee2 = aVar4.bytes._2_6_;
                  s._0_8_ = aVar5.len;
                  s.heartbeat = (uint16_t)frame_max;
                  iVar6 = amqp_send_method_inner
                                    (state,0,0xa001f,(void *)decoded.time_point_ns,0,deadline);
                  if (-1 < iVar6) {
                    amqp_release_buffers(state);
                    replies[0] = 0xa0029;
                    replies[1] = 0;
                    _s = amqp_cstring_bytes(local_1e0);
                    simple_rpc_inner((amqp_rpc_reply_t *)local_1c8,state,0,0xa0028,replies,&s,
                                     deadline);
                    method.decoded = (void *)local_1c8._16_8_;
                    frame_max = local_1c8._4_4_;
                    channel_max = local_1b0.decimal.value;
                    method._4_4_ = local_1c8._12_4_;
                    if (local_1c8._0_4_ == AMQP_RESPONSE_NORMAL) {
                      amqp_maybe_release_buffers(state);
                      local_1c8._0_4_ = AMQP_RESPONSE_NORMAL;
                      method.decoded = (amqp_pool_t *)0x0;
                      local_1b0.boolean = 0;
                      local_1c8._8_4_ = 0;
                    }
                    goto LAB_001091d7;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  (*state->socket->klass->close)(state->socket,AMQP_SC_FORCE);
  local_1c8._0_4_ = AMQP_RESPONSE_LIBRARY_EXCEPTION;
  method.decoded = (void *)decoded.time_point_ns;
  local_1c8._8_4_ = extraout_EDX;
  method._4_4_ = uVar10;
  local_1b0.boolean = iVar6;
LAB_001091d7:
  __return_storage_ptr__->reply_type = local_1c8._0_4_;
  *(int *)&__return_storage_ptr__->field_0x4 = frame_max;
  (__return_storage_ptr__->reply).id = local_1c8._8_4_;
  *(undefined4 *)&(__return_storage_ptr__->reply).field_0x4 = method._4_4_;
  (__return_storage_ptr__->reply).decoded = method.decoded;
  __return_storage_ptr__->library_error = local_1b0.boolean;
  *(int *)&__return_storage_ptr__->field_0x1c = channel_max;
  return __return_storage_ptr__;
}

Assistant:

static amqp_rpc_reply_t amqp_login_inner(amqp_connection_state_t state,
                                         char const *vhost, int channel_max,
                                         int frame_max, int heartbeat,
                                         const amqp_table_t *client_properties,
                                         const struct timeval *timeout,
                                         amqp_sasl_method_enum sasl_method,
                                         va_list vl) {
  int res;
  amqp_method_t method;

  uint16_t client_channel_max;
  uint32_t client_frame_max;
  uint16_t client_heartbeat;

  uint16_t server_channel_max;
  uint32_t server_frame_max;
  uint16_t server_heartbeat;

  amqp_rpc_reply_t result;
  amqp_time_t deadline;

  if (channel_max < 0 || channel_max > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_channel_max = (uint16_t)channel_max;

  if (frame_max < 0) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_frame_max = (uint32_t)frame_max;

  if (heartbeat < 0 || heartbeat > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_heartbeat = (uint16_t)heartbeat;

  res = amqp_time_from_now(&deadline, timeout);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  res = send_header_inner(state, deadline);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  res = simple_wait_method_inner(state, 0, AMQP_CONNECTION_START_METHOD,
                                 deadline, &method);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  {
    amqp_connection_start_t *s = (amqp_connection_start_t *)method.decoded;
    if ((s->version_major != AMQP_PROTOCOL_VERSION_MAJOR) ||
        (s->version_minor != AMQP_PROTOCOL_VERSION_MINOR)) {
      res = AMQP_STATUS_INCOMPATIBLE_AMQP_VERSION;
      goto error_res;
    }

    res = amqp_table_clone(&s->server_properties, &state->server_properties,
                           &state->properties_pool);

    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }

    /* TODO: check that our chosen SASL mechanism is in the list of
       acceptable mechanisms. Or even let the application choose from
       the list! */
    if (!sasl_mechanism_in_list(s->mechanisms, sasl_method)) {
      res = AMQP_STATUS_BROKER_UNSUPPORTED_SASL_METHOD;
      goto error_res;
    }
  }

  {
    amqp_table_entry_t default_properties[6];
    amqp_table_t default_table;
    amqp_table_entry_t client_capabilities[2];
    amqp_table_t client_capabilities_table;
    amqp_connection_start_ok_t s;
    amqp_pool_t *channel_pool;
    amqp_bytes_t response_bytes;

    channel_pool = amqp_get_or_create_channel_pool(state, 0);
    if (NULL == channel_pool) {
      res = AMQP_STATUS_NO_MEMORY;
      goto error_res;
    }

    response_bytes = sasl_response(channel_pool, sasl_method, vl);
    if (response_bytes.bytes == NULL) {
      res = AMQP_STATUS_NO_MEMORY;
      goto error_res;
    }

    client_capabilities[0] =
        amqp_table_construct_bool_entry("authentication_failure_close", 1);
    client_capabilities[1] =
        amqp_table_construct_bool_entry("exchange_exchange_bindings", 1);

    client_capabilities_table.entries = client_capabilities;
    client_capabilities_table.num_entries =
        sizeof(client_capabilities) / sizeof(amqp_table_entry_t);

    default_properties[0] =
        amqp_table_construct_utf8_entry("product", "rabbitmq-c");
    default_properties[1] =
        amqp_table_construct_utf8_entry("version", AMQP_VERSION_STRING);
    default_properties[2] =
        amqp_table_construct_utf8_entry("platform", AMQ_PLATFORM);
    default_properties[3] =
        amqp_table_construct_utf8_entry("copyright", AMQ_COPYRIGHT);
    default_properties[4] = amqp_table_construct_utf8_entry(
        "information", "See https://github.com/alanxz/rabbitmq-c");
    default_properties[5] = amqp_table_construct_table_entry(
        "capabilities", &client_capabilities_table);

    default_table.entries = default_properties;
    default_table.num_entries =
        sizeof(default_properties) / sizeof(amqp_table_entry_t);

    res = amqp_merge_capabilities(&default_table, client_properties,
                                  &state->client_properties, channel_pool);
    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }

    s.client_properties = state->client_properties;
    s.mechanism = sasl_method_name(sasl_method);
    s.response = response_bytes;
    s.locale = amqp_literal_bytes("en_US");

    res = amqp_send_method_inner(state, 0, AMQP_CONNECTION_START_OK_METHOD, &s,
                                 AMQP_SF_NONE, deadline);
    if (res < 0) {
      goto error_res;
    }
  }

  amqp_release_buffers(state);

  {
    amqp_method_number_t expected[] = {AMQP_CONNECTION_TUNE_METHOD,
                                       AMQP_CONNECTION_CLOSE_METHOD, 0};

    res = amqp_simple_wait_method_list(state, 0, expected, deadline, &method);
    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }
  }

  if (AMQP_CONNECTION_CLOSE_METHOD == method.id) {
    result.reply_type = AMQP_RESPONSE_SERVER_EXCEPTION;
    result.reply = method;
    result.library_error = 0;
    goto out;
  }

  {
    amqp_connection_tune_t *s = (amqp_connection_tune_t *)method.decoded;
    server_channel_max = s->channel_max;
    server_frame_max = s->frame_max;
    server_heartbeat = s->heartbeat;
  }

  if (server_channel_max != 0 &&
      (server_channel_max < client_channel_max || client_channel_max == 0)) {
    client_channel_max = server_channel_max;
  } else if (server_channel_max == 0 && client_channel_max == 0) {
    client_channel_max = UINT16_MAX;
  }

  if (server_frame_max != 0 && server_frame_max < client_frame_max) {
    client_frame_max = server_frame_max;
  }

  if (server_heartbeat != 0 && server_heartbeat < client_heartbeat) {
    client_heartbeat = server_heartbeat;
  }

  res = amqp_tune_connection(state, client_channel_max, client_frame_max,
                             client_heartbeat);
  if (res < 0) {
    goto error_res;
  }

  {
    amqp_connection_tune_ok_t s;
    s.frame_max = client_frame_max;
    s.channel_max = client_channel_max;
    s.heartbeat = client_heartbeat;

    res = amqp_send_method_inner(state, 0, AMQP_CONNECTION_TUNE_OK_METHOD, &s,
                                 AMQP_SF_NONE, deadline);
    if (res < 0) {
      goto error_res;
    }
  }

  amqp_release_buffers(state);

  {
    amqp_method_number_t replies[] = {AMQP_CONNECTION_OPEN_OK_METHOD, 0};
    amqp_connection_open_t s;
    s.virtual_host = amqp_cstring_bytes(vhost);
    s.capabilities = amqp_empty_bytes;
    s.insist = 1;

    result = simple_rpc_inner(state, 0, AMQP_CONNECTION_OPEN_METHOD, replies,
                              &s, deadline);
    if (result.reply_type != AMQP_RESPONSE_NORMAL) {
      goto out;
    }
  }

  result.reply_type = AMQP_RESPONSE_NORMAL;
  result.reply.id = 0;
  result.reply.decoded = NULL;
  result.library_error = 0;
  amqp_maybe_release_buffers(state);

out:
  return result;

error_res:
  amqp_socket_close(state->socket, AMQP_SC_FORCE);
  result = amqp_rpc_reply_error(res);

  goto out;
}